

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O2

void __thiscall leveldb::log::_Test_PartialLastIsIgnored::_Run(_Test_PartialLastIsIgnored *this)

{
  int local_1dc;
  string local_1d8;
  Tester local_1b8;
  
  std::__cxx11::string::string((string *)&local_1d8,"bar",(allocator *)&local_1dc);
  BigString((string *)&local_1b8,&local_1d8,0x8000);
  LogTest::Write(&this->super_LogTest,(string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1d8);
  LogTest::ShrinkSize(&this->super_LogTest,1);
  test::Tester::Tester
            (&local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc"
             ,0x1d9);
  LogTest::Read_abi_cxx11_(&local_1d8,&this->super_LogTest);
  test::Tester::IsEq<char[4],std::__cxx11::string>(&local_1b8,(char (*) [4])"EOF",&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  test::Tester::~Tester(&local_1b8);
  test::Tester::Tester
            (&local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc"
             ,0x1da);
  std::__cxx11::string::string
            ((string *)&local_1d8,(string *)&(this->super_LogTest).report_.message_);
  test::Tester::IsEq<char[1],std::__cxx11::string>(&local_1b8,(char (*) [1])0x10e022,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  test::Tester::~Tester(&local_1b8);
  test::Tester::Tester
            (&local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc"
             ,0x1db);
  local_1dc = 0;
  local_1d8._M_dataplus._M_p = (pointer)(this->super_LogTest).report_.dropped_bytes_;
  test::Tester::IsEq<int,unsigned_long>(&local_1b8,&local_1dc,(unsigned_long *)&local_1d8);
  test::Tester::~Tester(&local_1b8);
  return;
}

Assistant:

TEST(LogTest, PartialLastIsIgnored) {
  Write(BigString("bar", kBlockSize));
  // Cause a bad record length in the LAST block.
  ShrinkSize(1);
  ASSERT_EQ("EOF", Read());
  ASSERT_EQ("", ReportMessage());
  ASSERT_EQ(0, DroppedBytes());
}